

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# serialization.hpp
# Opt level: O2

void __thiscall diy::MemoryBuffer::MemoryBuffer(MemoryBuffer *this,MemoryBuffer *param_2)

{
  pointer pcVar1;
  pointer pBVar2;
  
  (this->super_BinaryBuffer)._vptr_BinaryBuffer = (_func_int **)&PTR__MemoryBuffer_001386b8;
  this->position = param_2->position;
  pcVar1 = (param_2->buffer).super__Vector_base<char,_std::allocator<char>_>._M_impl.
           super__Vector_impl_data._M_finish;
  (this->buffer).super__Vector_base<char,_std::allocator<char>_>._M_impl.super__Vector_impl_data.
  _M_start = (param_2->buffer).super__Vector_base<char,_std::allocator<char>_>._M_impl.
             super__Vector_impl_data._M_start;
  (this->buffer).super__Vector_base<char,_std::allocator<char>_>._M_impl.super__Vector_impl_data.
  _M_finish = pcVar1;
  (this->buffer).super__Vector_base<char,_std::allocator<char>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage =
       (param_2->buffer).super__Vector_base<char,_std::allocator<char>_>._M_impl.
       super__Vector_impl_data._M_end_of_storage;
  (param_2->buffer).super__Vector_base<char,_std::allocator<char>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = (pointer)0x0;
  (param_2->buffer).super__Vector_base<char,_std::allocator<char>_>._M_impl.super__Vector_impl_data.
  _M_start = (pointer)0x0;
  (param_2->buffer).super__Vector_base<char,_std::allocator<char>_>._M_impl.super__Vector_impl_data.
  _M_finish = (pointer)0x0;
  this->blob_position = param_2->blob_position;
  pBVar2 = (param_2->blobs).super__Vector_base<diy::BinaryBlob,_std::allocator<diy::BinaryBlob>_>.
           _M_impl.super__Vector_impl_data._M_finish;
  (this->blobs).super__Vector_base<diy::BinaryBlob,_std::allocator<diy::BinaryBlob>_>._M_impl.
  super__Vector_impl_data._M_start =
       (param_2->blobs).super__Vector_base<diy::BinaryBlob,_std::allocator<diy::BinaryBlob>_>.
       _M_impl.super__Vector_impl_data._M_start;
  (this->blobs).super__Vector_base<diy::BinaryBlob,_std::allocator<diy::BinaryBlob>_>._M_impl.
  super__Vector_impl_data._M_finish = pBVar2;
  (this->blobs).super__Vector_base<diy::BinaryBlob,_std::allocator<diy::BinaryBlob>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage =
       (param_2->blobs).super__Vector_base<diy::BinaryBlob,_std::allocator<diy::BinaryBlob>_>.
       _M_impl.super__Vector_impl_data._M_end_of_storage;
  (param_2->blobs).super__Vector_base<diy::BinaryBlob,_std::allocator<diy::BinaryBlob>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (param_2->blobs).super__Vector_base<diy::BinaryBlob,_std::allocator<diy::BinaryBlob>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  (param_2->blobs).super__Vector_base<diy::BinaryBlob,_std::allocator<diy::BinaryBlob>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  return;
}

Assistant:

MemoryBuffer(MemoryBuffer&&)                =default;